

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

void __thiscall soul::SimpleTokeniser::throwError(SimpleTokeniser *this,CompileMessage *message)

{
  CompileMessage CStack_48;
  
  CompileMessage::CompileMessage(&CStack_48,message);
  CodeLocation::throwError(&(this->super_SOULTokeniser).location,&CStack_48);
}

Assistant:

[[noreturn]] void throwError (const CompileMessage& message) const override
    {
        location.throwError (message);
    }